

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicKReach.cpp
# Opt level: O1

void __thiscall
DynamicKReach::fix_changes
          (DynamicKReach *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  byte bVar1;
  vertex_t v;
  pointer puVar2;
  uint *puVar3;
  pointer puVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  ulong uVar6;
  pointer ppVar7;
  uint *puVar8;
  ulong uVar9;
  ulong uVar10;
  uint *nxt;
  pointer puVar11;
  uint uVar12;
  
  puVar11 = (this->updated_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start;
  puVar2 = (this->updated_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar11 != puVar2) {
    do {
      pvVar5 = Graph::predecessors(this->graph_,*puVar11);
      puVar3 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar8 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start; puVar8 != puVar3; puVar8 = puVar8 + 1)
      {
        uVar6 = (ulong)*puVar8;
        puVar4 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
        uVar10 = uVar6;
        if ((uVar9 <= uVar6) || (uVar10 = (ulong)*puVar11, uVar9 <= uVar10)) goto LAB_001074a5;
        if (puVar4[uVar6] + 1 < (uint)puVar4[uVar10]) {
          puVar4[uVar10] = puVar4[uVar6] + 1;
        }
      }
      uVar10 = (ulong)*puVar11;
      puVar4 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) <= uVar10) {
LAB_001074a5:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar10);
      }
      std::
      priority_queue<std::pair<unsigned_char,unsigned_int>,std::vector<std::pair<unsigned_char,unsigned_int>,std::allocator<std::pair<unsigned_char,unsigned_int>>>,std::greater<std::pair<unsigned_char,unsigned_int>>>
      ::emplace<unsigned_char&,unsigned_int_const&>
                ((priority_queue<std::pair<unsigned_char,unsigned_int>,std::vector<std::pair<unsigned_char,unsigned_int>,std::allocator<std::pair<unsigned_char,unsigned_int>>>,std::greater<std::pair<unsigned_char,unsigned_int>>>
                  *)&this->quedist_,puVar4 + uVar10,puVar11);
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar2);
  }
  ppVar7 = (this->quedist_).c.
           super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar7 != (this->quedist_).c.
                super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      bVar1 = ppVar7->first;
      v = ppVar7->second;
      std::
      priority_queue<std::pair<unsigned_char,_unsigned_int>,_std::vector<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>,_std::greater<std::pair<unsigned_char,_unsigned_int>_>_>
      ::pop(&this->quedist_);
      if (bVar1 < this->k_) {
        pvVar5 = Graph::successors(this->graph_,v);
        puVar11 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        puVar2 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (puVar11 != puVar2) {
          uVar12 = bVar1 + 1;
          do {
            uVar10 = (ulong)*puVar11;
            puVar4 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(dist->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) <= uVar10)
            goto LAB_001074a5;
            if (uVar12 < puVar4[uVar10]) {
              puVar4[uVar10] = (uchar)uVar12;
              uVar10 = (ulong)*puVar11;
              puVar4 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(dist->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar4) <= uVar10)
              goto LAB_001074a5;
              std::
              priority_queue<std::pair<unsigned_char,unsigned_int>,std::vector<std::pair<unsigned_char,unsigned_int>,std::allocator<std::pair<unsigned_char,unsigned_int>>>,std::greater<std::pair<unsigned_char,unsigned_int>>>
              ::emplace<unsigned_char&,unsigned_int_const&>
                        ((priority_queue<std::pair<unsigned_char,unsigned_int>,std::vector<std::pair<unsigned_char,unsigned_int>,std::allocator<std::pair<unsigned_char,unsigned_int>>>,std::greater<std::pair<unsigned_char,unsigned_int>>>
                          *)&this->quedist_,puVar4 + uVar10,puVar11);
            }
            puVar11 = puVar11 + 1;
          } while (puVar11 != puVar2);
        }
      }
      ppVar7 = (this->quedist_).c.
               super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (ppVar7 != (this->quedist_).c.
                       super__Vector_base<std::pair<unsigned_char,_unsigned_int>,_std::allocator<std::pair<unsigned_char,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void DynamicKReach::fix_changes(std::vector<distance_t> &dist) {
    for (const auto &w : updated_) {
        for (const auto &prv : graph_.predecessors(w)) {
            if (dist.at(prv) + 1 < dist.at(w)) {
                dist.at(w) = dist.at(prv) + 1;
            }
        }
        quedist_.emplace(dist.at(w), w);
    }
    while (!quedist_.empty()) {
        auto d = quedist_.top().first;
        auto w = quedist_.top().second;
        quedist_.pop();
        if (d >= k_) {
            continue;
        }
        for (const auto &nxt : graph_.successors(w)) {
            if (dist.at(nxt) > d + 1) {
                dist.at(nxt) = d + 1;
                quedist_.emplace(dist.at(nxt), nxt);
            }
        }
    }
}